

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void av1_lowbd_inv_txfm2d_add_idtx_ssse3(int32_t *input,uint8_t *output,int stride,TX_SIZE tx_size)

{
  int col;
  int row;
  byte in_CL;
  int in_stack_00000008;
  int in_stack_0000000c;
  __m128i buf [8];
  int j;
  int i;
  int rect_type;
  int input_stride;
  int row_max;
  int col_max;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int in_stack_000002c0;
  int local_d0;
  int local_cc;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  __m128i *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  uint8_t *in_stack_ffffffffffffff98;
  __m128i *in_stack_ffffffffffffffa0;
  __m128i *in_stack_ffffffffffffffa8;
  int local_48;
  int local_44;
  
  get_txw_idx(in_CL);
  get_txh_idx(in_CL);
  col = tx_size_wide[in_CL];
  row = tx_size_high[in_CL];
  local_cc = col;
  if (0x20 < col) {
    local_cc = 0x20;
  }
  local_d0 = row;
  if (0x20 < row) {
    local_d0 = 0x20;
  }
  get_rect_tx_log_ratio(col,row);
  for (local_44 = 0; local_44 < local_cc >> 3; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < local_d0 >> 3; local_48 = local_48 + 1) {
      iidentity_row_8xn_ssse3
                ((__m128i *)buf[1][0],(int32_t *)buf[0][1],buf[0][0]._4_4_,(int)buf[0][0],
                 in_stack_0000000c,in_stack_00000008,in_stack_000002c0);
      transpose_16bit_8x8(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      iidentity_col_8xn_ssse3
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_idtx_ssse3(const int32_t *input, uint8_t *output,
                                         int stride, TX_SIZE tx_size) {
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int col_max = AOMMIN(32, txfm_size_col);
  const int row_max = AOMMIN(32, txfm_size_row);
  const int input_stride = row_max;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  for (int i = 0; i < (col_max >> 3); ++i) {
    for (int j = 0; j < (row_max >> 3); j++) {
      __m128i buf[8];
      iidentity_row_8xn_ssse3(buf, input + j * 8 + i * 8 * input_stride,
                              row_max, shift[0], 8, txw_idx, rect_type);
      transpose_16bit_8x8(buf, buf);
      iidentity_col_8xn_ssse3(output + i * 8 + j * 8 * stride, stride, buf,
                              shift[1], 8, txh_idx);
    }
  }
}